

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

StringConvertResult
absl::lts_20250127::str_format_internal::FormatConvertImpl
          (string_view v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl conv_local;
  string_view v_local;
  
  bVar1 = anon_unknown_53::ConvertStringArg(v,conv,sink);
  return (StringConvertResult)bVar1;
}

Assistant:

StringConvertResult FormatConvertImpl(string_view v,
                                      const FormatConversionSpecImpl conv,
                                      FormatSinkImpl *sink) {
  return {ConvertStringArg(v, conv, sink)};
}